

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::anon_unknown_0::generateUniformMatrixCaseBlocks
          (anon_unknown_0 *this,Context *context,SharedPtr *parentStructure,
          TestCaseGroup *targetGroup,
          _func_void_Context_ptr_SharedPtr_ptr_TestCaseGroup_ptr_bool_bool *blockContentGenerator)

{
  bool bVar1;
  undefined1 uVar2;
  MatrixOrder MVar3;
  Node *pNVar4;
  SharedPtrStateBase *pSVar5;
  Node *pNVar6;
  TestNode *node;
  deInt32 *pdVar7;
  long lVar8;
  byte bVar9;
  SharedPtr subStructure;
  Layout layout;
  SharedPtr local_90;
  Node *local_80;
  SharedPtrStateBase *local_78;
  Node *local_70;
  SharedPtrStateBase *local_68;
  Context *local_60;
  _func_void_Context_ptr_SharedPtr_ptr_TestCaseGroup_ptr_bool_bool *local_58;
  TestNode *local_50;
  _func_int **local_44 [2];
  MatrixOrder local_34;
  
  local_60 = (Context *)this;
  local_58 = blockContentGenerator;
  local_50 = &targetGroup->super_TestNode;
  pNVar4 = (Node *)operator_new(0x20);
  pNVar4->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
  pNVar4->m_type = TYPE_DEFAULT_BLOCK;
  (pNVar4->m_enclosingNode).m_ptr = (Node *)context;
  (pNVar4->m_enclosingNode).m_state = (SharedPtrStateBase *)parentStructure;
  if (parentStructure != (SharedPtr *)0x0) {
    LOCK();
    *(int *)&parentStructure->m_state = *(int *)&parentStructure->m_state + 1;
    UNLOCK();
    LOCK();
    pdVar7 = &((pNVar4->m_enclosingNode).m_state)->weakRefCount;
    *pdVar7 = *pdVar7 + 1;
    UNLOCK();
  }
  pNVar4->_vptr_Node = (_func_int **)&PTR__Node_0216b330;
  local_70 = pNVar4;
  pSVar5 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar5->strongRefCount = 0;
  pSVar5->weakRefCount = 0;
  pSVar5->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
  pSVar5[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar4;
  pSVar5->strongRefCount = 1;
  pSVar5->weakRefCount = 1;
  local_68 = pSVar5;
  pNVar6 = (Node *)operator_new(0x28);
  pNVar6->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
  pNVar6->m_type = TYPE_STORAGE_QUALIFIER;
  (pNVar6->m_enclosingNode).m_ptr = pNVar4;
  (pNVar6->m_enclosingNode).m_state = pSVar5;
  LOCK();
  pSVar5->strongRefCount = pSVar5->strongRefCount + 1;
  UNLOCK();
  LOCK();
  pdVar7 = &((pNVar6->m_enclosingNode).m_state)->weakRefCount;
  *pdVar7 = *pdVar7 + 1;
  UNLOCK();
  pNVar6->_vptr_Node = (_func_int **)&PTR__Node_0216b368;
  *(undefined4 *)&pNVar6[1]._vptr_Node = 3;
  local_80 = pNVar6;
  local_78 = (SharedPtrStateBase *)operator_new(0x20);
  local_78->strongRefCount = 0;
  local_78->weakRefCount = 0;
  local_78->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
  local_78[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar6;
  local_78->strongRefCount = 1;
  local_78->weakRefCount = 1;
  lVar8 = 0x14;
  do {
    local_90.m_ptr = local_80;
    if (local_78 != (SharedPtrStateBase *)0x0) {
      LOCK();
      local_78->strongRefCount = local_78->strongRefCount + 1;
      UNLOCK();
      LOCK();
      local_78->weakRefCount = local_78->weakRefCount + 1;
      UNLOCK();
    }
    local_90.m_state = local_78;
    node = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)node,local_60->m_testCtx,
               *(char **)((long)&PTR_typeinfo_name_0216b548 + lVar8 + 4),
               *(char **)((long)&PTR_typeinfo_0216b550 + lVar8 + 4));
    bVar1 = (bool)(&UNK_0216b55e)[lVar8];
    if (bVar1 == true) {
      bVar9 = (&UNK_0216b55c)[lVar8] ^ 1;
    }
    else {
      bVar9 = false;
    }
    tcu::TestNode::addChild(local_50,node);
    MVar3 = *(MatrixOrder *)((long)&generateUniformMatrixCaseBlocks::children[0].name + lVar8);
    if (MVar3 != MATRIXORDER_LAST) {
      glu::Layout::Layout((Layout *)local_44,-1,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
      local_34 = MVar3;
      pNVar4 = (Node *)operator_new(0x38);
      pNVar4->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
      pNVar4->m_type = TYPE_LAYOUT_QUALIFIER;
      (pNVar4->m_enclosingNode).m_ptr = local_90.m_ptr;
      (pNVar4->m_enclosingNode).m_state = local_90.m_state;
      if (local_90.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (local_90.m_state)->strongRefCount = (local_90.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        pdVar7 = &((pNVar4->m_enclosingNode).m_state)->weakRefCount;
        *pdVar7 = *pdVar7 + 1;
        UNLOCK();
      }
      pNVar4->_vptr_Node = (_func_int **)&PTR__Node_0216b530;
      pNVar4[1]._vptr_Node = local_44[0];
      *(_func_int ***)&pNVar4[1].m_type = local_44[1];
      *(MatrixOrder *)&pNVar4[1].m_enclosingNode.m_ptr = local_34;
      pSVar5 = (SharedPtrStateBase *)operator_new(0x20);
      pSVar5->strongRefCount = 0;
      pSVar5->weakRefCount = 0;
      pSVar5->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
      pSVar5[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar4;
      pSVar5->strongRefCount = 1;
      pSVar5->weakRefCount = 1;
      if (local_90.m_state != pSVar5) {
        if (local_90.m_state != (SharedPtrStateBase *)0x0) {
          LOCK();
          pdVar7 = &(local_90.m_state)->strongRefCount;
          *pdVar7 = *pdVar7 + -1;
          UNLOCK();
          if (*pdVar7 == 0) {
            local_90.m_ptr = (Node *)0x0;
            (*(local_90.m_state)->_vptr_SharedPtrStateBase[2])();
          }
          LOCK();
          pdVar7 = &(local_90.m_state)->weakRefCount;
          *pdVar7 = *pdVar7 + -1;
          UNLOCK();
          if ((*pdVar7 == 0) && (local_90.m_state != (SharedPtrStateBase *)0x0)) {
            (*(local_90.m_state)->_vptr_SharedPtrStateBase[1])();
          }
        }
        LOCK();
        pSVar5->strongRefCount = pSVar5->strongRefCount + 1;
        UNLOCK();
        LOCK();
        pSVar5->weakRefCount = pSVar5->weakRefCount + 1;
        UNLOCK();
        local_90.m_ptr = pNVar4;
        local_90.m_state = pSVar5;
      }
      pdVar7 = &pSVar5->strongRefCount;
      LOCK();
      *pdVar7 = *pdVar7 + -1;
      UNLOCK();
      if (*pdVar7 == 0) {
        (*pSVar5->_vptr_SharedPtrStateBase[2])(pSVar5);
      }
      pdVar7 = &pSVar5->weakRefCount;
      LOCK();
      *pdVar7 = *pdVar7 + -1;
      UNLOCK();
      if (*pdVar7 == 0) {
        (*pSVar5->_vptr_SharedPtrStateBase[1])(pSVar5);
      }
    }
    if ((&UNK_0216b55c)[lVar8] == '\x01') {
      pNVar4 = (Node *)operator_new(0x28);
      uVar2 = (&UNK_0216b55d)[lVar8];
      pNVar4->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
      pNVar4->m_type = TYPE_INTERFACE_BLOCK;
      (pNVar4->m_enclosingNode).m_ptr = local_90.m_ptr;
      (pNVar4->m_enclosingNode).m_state = local_90.m_state;
      if (local_90.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (local_90.m_state)->strongRefCount = (local_90.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        pdVar7 = &((pNVar4->m_enclosingNode).m_state)->weakRefCount;
        *pdVar7 = *pdVar7 + 1;
        UNLOCK();
      }
      pNVar4->_vptr_Node = (_func_int **)&PTR__Node_0216b3a0;
      *(undefined1 *)&pNVar4[1]._vptr_Node = uVar2;
      pSVar5 = (SharedPtrStateBase *)operator_new(0x20);
      pSVar5->strongRefCount = 0;
      pSVar5->weakRefCount = 0;
      pSVar5->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
      pSVar5[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar4;
      pSVar5->strongRefCount = 1;
      pSVar5->weakRefCount = 1;
      if (local_90.m_state != pSVar5) {
        if (local_90.m_state != (SharedPtrStateBase *)0x0) {
          LOCK();
          pdVar7 = &(local_90.m_state)->strongRefCount;
          *pdVar7 = *pdVar7 + -1;
          UNLOCK();
          if (*pdVar7 == 0) {
            local_90.m_ptr = (Node *)0x0;
            (*(local_90.m_state)->_vptr_SharedPtrStateBase[2])();
          }
          LOCK();
          pdVar7 = &(local_90.m_state)->weakRefCount;
          *pdVar7 = *pdVar7 + -1;
          UNLOCK();
          if ((*pdVar7 == 0) && (local_90.m_state != (SharedPtrStateBase *)0x0)) {
            (*(local_90.m_state)->_vptr_SharedPtrStateBase[1])();
          }
        }
        LOCK();
        pSVar5->strongRefCount = pSVar5->strongRefCount + 1;
        UNLOCK();
        LOCK();
        pSVar5->weakRefCount = pSVar5->weakRefCount + 1;
        UNLOCK();
        local_90.m_ptr = pNVar4;
        local_90.m_state = pSVar5;
      }
      pdVar7 = &pSVar5->strongRefCount;
      LOCK();
      *pdVar7 = *pdVar7 + -1;
      UNLOCK();
      if (*pdVar7 == 0) {
        (*pSVar5->_vptr_SharedPtrStateBase[2])(pSVar5);
      }
      pdVar7 = &pSVar5->weakRefCount;
      LOCK();
      *pdVar7 = *pdVar7 + -1;
      UNLOCK();
      if (*pdVar7 == 0) {
        (*pSVar5->_vptr_SharedPtrStateBase[1])(pSVar5);
      }
    }
    (*local_58)(local_60,&local_90,(TestCaseGroup *)node,bVar1,(bool)bVar9);
    if (local_90.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar7 = &(local_90.m_state)->strongRefCount;
      *pdVar7 = *pdVar7 + -1;
      UNLOCK();
      if (*pdVar7 == 0) {
        local_90.m_ptr = (Node *)0x0;
        (*(local_90.m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar7 = &(local_90.m_state)->weakRefCount;
      *pdVar7 = *pdVar7 + -1;
      UNLOCK();
      if ((*pdVar7 == 0) && (local_90.m_state != (SharedPtrStateBase *)0x0)) {
        (*(local_90.m_state)->_vptr_SharedPtrStateBase[1])();
      }
    }
    pSVar5 = local_78;
    lVar8 = lVar8 + 0x18;
  } while (lVar8 != 0xbc);
  if (local_78 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar7 = &local_78->strongRefCount;
    *pdVar7 = *pdVar7 + -1;
    UNLOCK();
    if (*pdVar7 == 0) {
      local_80 = (Node *)0x0;
      (*local_78->_vptr_SharedPtrStateBase[2])(local_78);
    }
    LOCK();
    pdVar7 = &pSVar5->weakRefCount;
    *pdVar7 = *pdVar7 + -1;
    UNLOCK();
    if ((*pdVar7 == 0) && (local_78 != (SharedPtrStateBase *)0x0)) {
      (*local_78->_vptr_SharedPtrStateBase[1])();
    }
  }
  pSVar5 = local_68;
  if (local_68 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar7 = &local_68->strongRefCount;
    *pdVar7 = *pdVar7 + -1;
    UNLOCK();
    if (*pdVar7 == 0) {
      local_70 = (Node *)0x0;
      (*local_68->_vptr_SharedPtrStateBase[2])(local_68);
    }
    LOCK();
    pdVar7 = &pSVar5->weakRefCount;
    *pdVar7 = *pdVar7 + -1;
    UNLOCK();
    if ((*pdVar7 == 0) && (local_68 != (SharedPtrStateBase *)0x0)) {
      (*local_68->_vptr_SharedPtrStateBase[1])();
    }
  }
  return;
}

Assistant:

static void generateUniformMatrixCaseBlocks (Context& context, const ResourceDefinition::Node::SharedPtr& parentStructure, tcu::TestCaseGroup* const targetGroup, void (*blockContentGenerator)(Context&, const ResourceDefinition::Node::SharedPtr&, tcu::TestCaseGroup* const, bool, bool))
{
	static const struct
	{
		const char*			name;
		const char*			description;
		bool				block;
		bool				namedBlock;
		bool				extendedBasicTypeCases;
		glu::MatrixOrder	order;
	} children[] =
	{
		{ "default_block",				"Default block",			false,	true,	true,	glu::MATRIXORDER_LAST			},
		{ "named_block",				"Named uniform block",		true,	true,	true,	glu::MATRIXORDER_LAST			},
		{ "named_block_row_major",		"Named uniform block",		true,	true,	false,	glu::MATRIXORDER_ROW_MAJOR		},
		{ "named_block_col_major",		"Named uniform block",		true,	true,	false,	glu::MATRIXORDER_COLUMN_MAJOR	},
		{ "unnamed_block",				"Unnamed uniform block",	true,	false,	false,	glu::MATRIXORDER_LAST			},
		{ "unnamed_block_row_major",	"Unnamed uniform block",	true,	false,	false,	glu::MATRIXORDER_ROW_MAJOR		},
		{ "unnamed_block_col_major",	"Unnamed uniform block",	true,	false,	false,	glu::MATRIXORDER_COLUMN_MAJOR	},
	};

	const ResourceDefinition::Node::SharedPtr defaultBlock	(new ResourceDefinition::DefaultBlock(parentStructure));
	const ResourceDefinition::Node::SharedPtr uniform		(new ResourceDefinition::StorageQualifier(defaultBlock, glu::STORAGE_UNIFORM));

	for (int childNdx = 0; childNdx < (int)DE_LENGTH_OF_ARRAY(children); ++childNdx)
	{
		ResourceDefinition::Node::SharedPtr	subStructure	= uniform;
		tcu::TestCaseGroup* const			blockGroup		= new tcu::TestCaseGroup(context.getTestContext(), children[childNdx].name, children[childNdx].description);
		const bool							addOpaqueCases	= children[childNdx].extendedBasicTypeCases && !children[childNdx].block;

		targetGroup->addChild(blockGroup);

		if (children[childNdx].order != glu::MATRIXORDER_LAST)
		{
			glu::Layout layout;
			layout.matrixOrder = children[childNdx].order;
			subStructure = ResourceDefinition::Node::SharedPtr(new ResourceDefinition::LayoutQualifier(subStructure, layout));
		}

		if (children[childNdx].block)
			subStructure = ResourceDefinition::Node::SharedPtr(new ResourceDefinition::InterfaceBlock(subStructure, children[childNdx].namedBlock));

		blockContentGenerator(context, subStructure, blockGroup, children[childNdx].extendedBasicTypeCases, addOpaqueCases);
	}
}